

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

void mp::internal::PrintSolution
               (double *values,int num_values,char *name_col,char *value_col,NameProvider *np)

{
  NameProvider *index;
  unsigned_long *puVar1;
  char *in_RDX;
  int in_ESI;
  long in_RDI;
  double value;
  int i_1;
  int i;
  size_t name_field_width;
  size_t name_len;
  BasicCStringRef<char> local_78;
  undefined8 local_70;
  int local_64;
  BasicCStringRef<char> local_60;
  StringRef local_58;
  char **in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar2;
  CStringRef arg0;
  
  if ((in_RDI != 0) && (in_ESI != 0)) {
    index = (NameProvider *)strlen(in_RDX);
    arg0.data_ = (char *)index;
    for (iVar2 = 0; iVar2 < in_ESI; iVar2 = iVar2 + 1) {
      local_58 = NameProvider::name((NameProvider *)arg0.data_,(size_t)index,
                                    CONCAT44(iVar2,in_stack_ffffffffffffffc0));
      in_stack_ffffffffffffffb8 = (char **)fmt::BasicStringRef<char>::size(&local_58);
      puVar1 = std::max<unsigned_long>
                         ((unsigned_long *)&stack0xffffffffffffffc8,
                          (unsigned_long *)&stack0xffffffffffffffb8);
      index = (NameProvider *)*puVar1;
    }
    puVar1 = (unsigned_long *)
             ((long)&(index->names_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                     ._M_impl.super__Vector_impl_data._M_start + 2);
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_60,"\n%-*s%s\n");
    fmt::printf<unsigned_long,char_const*,char_const*>
              (arg0,puVar1,(char **)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    for (local_64 = 0; local_64 < in_ESI; local_64 = local_64 + 1) {
      local_70 = *(undefined8 *)(in_RDI + (long)local_64 * 8);
      fmt::BasicCStringRef<char>::BasicCStringRef(&local_78,"%-*s%.17g\n");
      NameProvider::name((NameProvider *)arg0.data_,(size_t)puVar1,
                         CONCAT44(iVar2,in_stack_ffffffffffffffc0));
      fmt::printf<unsigned_long,fmt::BasicStringRef<char>,double>
                (arg0,puVar1,(BasicStringRef<char> *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                 (double *)in_stack_ffffffffffffffb8);
    }
  }
  return;
}

Assistant:

void PrintSolution(const double *values, int num_values, const char *name_col,
                   const char *value_col, NameProvider &np) {
  if (!values || num_values == 0)
    return;
  std::size_t name_len = std::strlen(name_col);
  std::size_t name_field_width = name_len;
  for (int i = 0; i < num_values; ++i)
    name_field_width = std::max(name_field_width, np.name(i).size());
  name_field_width += 2;
  fmt::printf("\n%-*s%s\n", name_field_width, name_col, value_col);
  for (int i = 0; i < num_values; ++i) {
    double value = values[i];
    fmt::printf("%-*s%.17g\n", name_field_width, np.name(i), value ? value : 0);
  }
}